

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler-ls.h
# Opt level: O3

void __thiscall
wabt::LoadStoreTracking::LoadStore
          (LoadStoreTracking *this,uint64_t offset,Opcode opc,Type type,Address align,Node *addr_exp
          )

{
  Address AVar1;
  bool bVar2;
  int iVar3;
  Enum EVar4;
  mapped_type *this_00;
  mapped_type *pmVar5;
  string_view s;
  string name;
  Opcode local_80;
  Opcode local_7c;
  uint64_t local_78;
  string local_70;
  Address local_50;
  string_view local_40;
  
  local_80.enum_ = opc.enum_;
  local_78 = offset;
  Opcode::GetInfo(&local_80);
  AVar1 = local_50;
  local_7c.enum_ = local_80.enum_;
  if (0xfffffffd < (uint)type.enum_) {
    Opcode::GetInfo(&local_7c);
    local_40.data_ = local_70._M_dataplus._M_p;
    local_40.size_ = strlen(local_70._M_dataplus._M_p);
    local_70._0_16_ = string_view::substr(&local_40,local_40.size_ - 2,0xffffffffffffffff);
    s.size_ = 2;
    s.data_ = "_u";
    iVar3 = string_view::compare((string_view *)&local_70,s);
    Opcode::GetInfo(&local_7c);
    if (local_50 == 4) {
      type.enum_ = -(uint)(iVar3 != 0) | I32U;
    }
    else {
      if (local_50 == 2) {
        EVar4 = I16U;
        type.enum_ = I16;
      }
      else {
        if (local_50 != 1) goto LAB_001548b0;
        EVar4 = I8U;
        type.enum_ = I8;
      }
      if (iVar3 == 0) {
        type.enum_ = EVar4;
      }
    }
  }
LAB_001548b0:
  AddrExpName_abi_cxx11_(&local_70,this,addr_exp);
  if (local_70._M_string_length != 0) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_wabt::LoadStoreTracking::LSVar>_>_>
              ::operator[](&this->vars,&local_70);
    pmVar5 = std::
             map<unsigned_long,_wabt::LoadStoreTracking::LSAccess,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_wabt::LoadStoreTracking::LSAccess>_>_>
             ::operator[](&this_00->accesses,&local_78);
    if ((pmVar5->byte_size != 0) &&
       (((pmVar5->byte_size != AVar1 || ((pmVar5->type).enum_ != type.enum_)) ||
        (pmVar5->align != align)))) {
      pmVar5->is_uniform = false;
    }
    bVar2 = Opcode::IsNaturallyAligned(&local_80,align);
    if (!bVar2) {
      pmVar5->is_uniform = false;
    }
    pmVar5->byte_size = AVar1;
    (pmVar5->type).enum_ = type.enum_;
    pmVar5->align = align;
    EVar4 = (this_00->same_type).enum_;
    if ((EVar4 == type.enum_ || EVar4 == Any) &&
       (this_00->same_align == align || this_00->same_align == 0xffffffff)) {
      (this_00->same_type).enum_ = type.enum_;
      this_00->same_align = align;
      (this_00->last_opc).enum_ = local_80.enum_;
    }
    else {
      this_00->same_type = Void;
      this_00->same_align = 0xffffffff;
    }
  }
  if ((string_view *)local_70._M_dataplus._M_p != (string_view *)&local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LoadStore(uint64_t offset, Opcode opc, Type type, Address align,
                 const Node& addr_exp) {
    auto byte_size = opc.GetMemorySize();
    type = GetMemoryType(type, opc);
    // We want to associate memory ops of a certain offset & size as being
    // relative to a uniquely identifiable pointer, such as a local.
    auto name = AddrExpName(addr_exp);
    if (name.empty()) {
      return;
    }
    auto& var = vars[name];
    auto& access = var.accesses[offset];
    // Check if previous access at this offset (if any) is of same size
    // and type (see Checklayouts below).
    if (access.byte_size &&
        ((access.byte_size != byte_size) ||
         (access.type != type) ||
         (access.align != align)))
      access.is_uniform = false;
    // Also exclude weird alignment accesses from structs.
    if (!opc.IsNaturallyAligned(align))
      access.is_uniform = false;
    access.byte_size = byte_size;
    access.type = type;
    access.align = align;
    // Additionally, check if all accesses are to the same type, so
    // if layout check fails, we can at least declare it as pointer to
    // a type.
    if ((var.same_type == type || var.same_type == Type::Any) &&
        (var.same_align == align || var.same_align == kInvalidAddress)) {
      var.same_type = type;
      var.same_align = align;
      var.last_opc = opc;
    } else {
      var.same_type = Type::Void;
      var.same_align = kInvalidAddress;
    }
  }